

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::EntryPointInfo::InstallGuards(EntryPointInfo *this,ScriptContext *scriptContext)

{
  TypeGuardTransferEntry this_00;
  code *pcVar1;
  PropertyId propertyId_00;
  TypeGuardTransferEntry *this_01;
  JitTransferData *this_02;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  LocalFunctionId LVar6;
  uint uVar7;
  NativeEntryPointData *this_03;
  undefined4 *puVar8;
  ThreadContext *this_04;
  undefined4 extraout_var;
  undefined8 uVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PropertyRecord *this_05;
  char16 *pcVar10;
  Recycler *pRVar11;
  FakePropertyGuardWeakReference **ppFVar12;
  FakePropertyGuardWeakReference *pFVar13;
  TypeGuardTransferEntry TVar14;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  bool local_572;
  bool local_571;
  bool local_561;
  bool local_531;
  ConstructorCache *cache_2;
  int entryCacheIndex;
  bool isValid_3;
  bool isNeeded_2;
  PropertyGuard *sharedPropertyGuard_3;
  Type pCStack_508;
  PropertyId propertyId_3;
  CtorCacheGuardTransferEntry *entry_1;
  ThreadContext *threadContext_2;
  ConstructorCache *cache_1;
  uint j;
  bool isValid_2;
  bool isNeeded_1;
  PropertyGuard *sharedPropertyGuard_2;
  PropertyId propertyId_2;
  uint i_2;
  CtorCacheTransferEntryIDL **entries;
  ThreadContext *threadContext_1;
  Type propertyGuardWeakRef;
  int guardIndex;
  JitIndexedPropertyGuard *guard_1;
  int entryGuardIndex;
  bool isValid_1;
  bool isNeeded;
  PropertyGuard *sharedPropertyGuard_1;
  Type pTStack_498;
  PropertyId propertyId_1;
  TypeGuardTransferEntry *entry;
  ThreadContext *threadContext;
  Type *propertyGuardWeakRefs;
  uint local_478;
  int propertyGuardCount;
  uint __i;
  uint i_1;
  EquivalentTypeCache *oldCache;
  JitEquivalentTypeGuard **guard;
  EquivalentTypeCache *cache;
  JitEquivalentTypeGuard **guards;
  WCHAR local_448 [2];
  int guardCount;
  WCHAR prefixValue [512];
  bool isValid;
  PropertyGuard *pPStack_38;
  bool hasSharedPropertyGuard;
  PropertyGuard *sharedPropertyGuard;
  PropertyId propertyId;
  int i;
  JitTransferData *jitTransferData;
  NativeEntryPointData *nativeEntryPointData;
  ScriptContext *scriptContext_local;
  EntryPointInfo *this_local;
  
  nativeEntryPointData = (NativeEntryPointData *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  jitTransferData = (JitTransferData *)GetNativeEntryPointData(this);
  this_03 = GetNativeEntryPointData(this);
  _propertyId = NativeEntryPointData::GetJitTransferData(this_03);
  if ((_propertyId == (JitTransferData *)0x0) ||
     (bVar2 = JitTransferData::GetIsReady(_propertyId), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x20de,
                                "(jitTransferData != nullptr && jitTransferData->GetIsReady())",
                                "jitTransferData != nullptr && jitTransferData->GetIsReady()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  for (sharedPropertyGuard._4_4_ = 0;
      sharedPropertyGuard._4_4_ < _propertyId->lazyBailoutPropertyCount;
      sharedPropertyGuard._4_4_ = sharedPropertyGuard._4_4_ + 1) {
    if (_propertyId->lazyBailoutProperties == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x20e2,"(jitTransferData->lazyBailoutProperties != nullptr)",
                                  "jitTransferData->lazyBailoutProperties != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    sharedPropertyGuard._0_4_ = _propertyId->lazyBailoutProperties[sharedPropertyGuard._4_4_];
    pPStack_38 = (PropertyGuard *)0x0;
    bVar2 = NativeEntryPointData::TryGetSharedPropertyGuard
                      ((NativeEntryPointData *)jitTransferData,(PropertyId)sharedPropertyGuard,
                       &stack0xffffffffffffffc8);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x20e7,"(hasSharedPropertyGuard)","hasSharedPropertyGuard");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    local_531 = false;
    if (bVar2) {
      local_531 = PropertyGuard::IsValid(pPStack_38);
    }
    if (local_531 == false) {
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,LazyBailoutPhase);
      if (bVar2) {
        iVar4 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])();
        uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x38))();
        iVar4 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])();
        uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)CONCAT44(extraout_var_00,iVar4));
        iVar4 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])();
        LVar6 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)CONCAT44(extraout_var_01,iVar4));
        iVar4 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])();
        uVar7 = FunctionProxy::GetFunctionNumber((FunctionProxy *)CONCAT44(extraout_var_02,iVar4));
        swprintf_s<512ul>((WCHAR (*) [512])local_448,L"Function %s (#%d.%u, #%u)",uVar9,(ulong)uVar5
                          ,(ulong)LVar6,(ulong)uVar7);
        this_05 = ScriptContext::GetPropertyName
                            ((ScriptContext *)nativeEntryPointData,(PropertyId)sharedPropertyGuard);
        pcVar10 = PropertyRecord::GetBuffer(this_05);
        Output::TraceWithPrefix
                  (LazyBailoutPhase,local_448,L"Lazy bailout - Invalidation due to property: %s \n",
                   pcVar10);
      }
      (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xd])(this,1);
      return;
    }
    this_04 = ScriptContext::GetThreadContext((ScriptContext *)nativeEntryPointData);
    ThreadContext::RegisterLazyBailout(this_04,(PropertyId)sharedPropertyGuard,this);
  }
  if (0 < _propertyId->equivalentTypeGuardCount) {
    if (_propertyId->equivalentTypeGuardOffsets != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x20f9,"(jitTransferData->equivalentTypeGuardOffsets == nullptr)"
                                  ,"jitTransferData->equivalentTypeGuardOffsets == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if (_propertyId->equivalentTypeGuards == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x20fa,"(jitTransferData->equivalentTypeGuards != nullptr)",
                                  "jitTransferData->equivalentTypeGuards != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    guards._4_4_ = _propertyId->equivalentTypeGuardCount;
    cache = (EquivalentTypeCache *)_propertyId->equivalentTypeGuards;
    guard = (JitEquivalentTypeGuard **)
            NativeEntryPointData::EnsureEquivalentTypeCache
                      ((NativeEntryPointData *)jitTransferData,guards._4_4_,
                       (ScriptContext *)nativeEntryPointData,this);
    for (oldCache = cache; oldCache < (EquivalentTypeCache *)(cache->types + guards._4_4_);
        oldCache = (EquivalentTypeCache *)(oldCache->types + 1)) {
      ___i = JitEquivalentTypeGuard::GetCache((JitEquivalentTypeGuard *)oldCache->types[0]);
      memcpy(guard,___i,0x5e);
      JitEquivalentTypeGuard::SetCache
                ((JitEquivalentTypeGuard *)oldCache->types[0],(EquivalentTypeCache *)guard);
      propertyGuardCount = 0;
      while( true ) {
        if (7 < (uint)propertyGuardCount) goto LAB_00a2e962;
        if (guard[(uint)propertyGuardCount] == (JitEquivalentTypeGuard *)0x0) break;
        Js::Type::SetHasBeenCached((Type *)guard[(uint)propertyGuardCount]);
        propertyGuardCount = propertyGuardCount + 1;
      }
      for (local_478 = propertyGuardCount; local_478 < 8; local_478 = local_478 + 1) {
        if (guard[local_478] != (JitEquivalentTypeGuard *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0x2115,"((*cache).types[__i] == nullptr)",
                                      "(*cache).types[__i] == nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
      }
LAB_00a2e962:
      guard = guard + 0xc;
    }
  }
  this_02 = jitTransferData;
  if (_propertyId->propertyGuardsByPropertyId != (Type)0x0) {
    iVar4 = _propertyId->propertyGuardCount;
    propertyGuardWeakRefs._4_4_ = iVar4;
    pRVar11 = ScriptContext::GetRecycler((ScriptContext *)nativeEntryPointData);
    threadContext =
         (ThreadContext *)
         NativeEntryPointData::EnsurePropertyGuardWeakRefs
                   ((NativeEntryPointData *)this_02,iVar4,pRVar11);
    entry = (TypeGuardTransferEntry *)
            ScriptContext::GetThreadContext((ScriptContext *)nativeEntryPointData);
    for (pTStack_498 = _propertyId->propertyGuardsByPropertyId; pTStack_498->propertyId != -1;
        pTStack_498 = pTStack_498 + (long)((int)guard_1 + 1) + 1) {
      sharedPropertyGuard_1._4_4_ = pTStack_498->propertyId;
      _entryGuardIndex = (PropertyGuard *)0x0;
      bVar2 = NativeEntryPointData::TryGetSharedPropertyGuard
                        ((NativeEntryPointData *)jitTransferData,sharedPropertyGuard_1._4_4_,
                         (PropertyGuard **)&entryGuardIndex);
      if (bVar2) {
        local_561 = PropertyGuard::IsValid(_entryGuardIndex);
      }
      else {
        local_561 = false;
      }
      guard_1._0_4_ = 0;
      while (pTStack_498[(long)(int)guard_1 + 1] != (TypeGuardTransferEntry)0x0) {
        if (bVar2) {
          this_00 = pTStack_498[(long)(int)guard_1 + 1];
          propertyGuardWeakRef.ptr._4_4_ =
               JitIndexedPropertyGuard::GetIndex((JitIndexedPropertyGuard *)this_00);
          if ((propertyGuardWeakRef.ptr._4_4_ < 0) ||
             (propertyGuardWeakRefs._4_4_ <= propertyGuardWeakRef.ptr._4_4_)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                        ,0x2187,
                                        "(guardIndex >= 0 && guardIndex < propertyGuardCount)",
                                        "guardIndex >= 0 && guardIndex < propertyGuardCount");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          if (local_561 == false) {
            PropertyGuard::Invalidate((PropertyGuard *)this_00);
          }
          else {
            Memory::WriteBarrierPtr<Js::FakePropertyGuardWeakReference>::WriteBarrierPtr
                      ((WriteBarrierPtr<Js::FakePropertyGuardWeakReference> *)&threadContext_1,
                       (WriteBarrierPtr<Js::FakePropertyGuardWeakReference> *)
                       ((threadContext->super_ThreadContextInfo).wellKnownHostTypeIds +
                       (long)propertyGuardWeakRef.ptr._4_4_ * 2 + -0x12));
            ppFVar12 = Memory::WriteBarrierPtr::operator_cast_to_FakePropertyGuardWeakReference__
                                 ((WriteBarrierPtr *)&threadContext_1);
            if (*ppFVar12 == (FakePropertyGuardWeakReference *)0x0) {
              pRVar11 = ScriptContext::GetRecycler((ScriptContext *)nativeEntryPointData);
              pFVar13 = FakePropertyGuardWeakReference::New(pRVar11,(PropertyGuard *)this_00);
              Memory::WriteBarrierPtr<Js::FakePropertyGuardWeakReference>::operator=
                        ((WriteBarrierPtr<Js::FakePropertyGuardWeakReference> *)&threadContext_1,
                         pFVar13);
              Memory::WriteBarrierPtr<Js::FakePropertyGuardWeakReference>::operator=
                        ((WriteBarrierPtr<Js::FakePropertyGuardWeakReference> *)
                         ((threadContext->super_ThreadContextInfo).wellKnownHostTypeIds +
                         (long)propertyGuardWeakRef.ptr._4_4_ * 2 + -0x12),
                         (WriteBarrierPtr<Js::FakePropertyGuardWeakReference> *)&threadContext_1);
            }
            pFVar13 = Memory::WriteBarrierPtr<Js::FakePropertyGuardWeakReference>::operator->
                                ((WriteBarrierPtr<Js::FakePropertyGuardWeakReference> *)
                                 &threadContext_1);
            TVar14 = (TypeGuardTransferEntry)
                     Memory::RecyclerWeakReference<Js::PropertyGuard>::Get
                               (&pFVar13->super_RecyclerWeakReference<Js::PropertyGuard>);
            if (TVar14 != this_00) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                          ,0x2192,"(propertyGuardWeakRef->Get() == guard)",
                                          "propertyGuardWeakRef->Get() == guard");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
            this_01 = entry;
            propertyId_00 = sharedPropertyGuard_1._4_4_;
            ppFVar12 = Memory::WriteBarrierPtr::operator_cast_to_FakePropertyGuardWeakReference__
                                 ((WriteBarrierPtr *)&threadContext_1);
            ThreadContext::RegisterUniquePropertyGuard
                      ((ThreadContext *)this_01,propertyId_00,
                       &(*ppFVar12)->super_RecyclerWeakReference<Js::PropertyGuard>);
          }
        }
        guard_1._0_4_ = (int)guard_1 + 1;
      }
    }
  }
  if ((_propertyId->ctorCacheTransferData).entries != (Type)0x0) {
    entries = (CtorCacheTransferEntryIDL **)
              ScriptContext::GetThreadContext((ScriptContext *)nativeEntryPointData);
    _propertyId_2 = (_propertyId->ctorCacheTransferData).entries;
    for (sharedPropertyGuard_2._4_4_ = 0;
        sharedPropertyGuard_2._4_4_ < (_propertyId->ctorCacheTransferData).ctorCachesCount;
        sharedPropertyGuard_2._4_4_ = sharedPropertyGuard_2._4_4_ + 1) {
      sharedPropertyGuard_2._0_4_ = _propertyId_2[sharedPropertyGuard_2._4_4_]->propId;
      _j = (PropertyGuard *)0x0;
      cache_1._7_1_ =
           NativeEntryPointData::TryGetSharedPropertyGuard
                     ((NativeEntryPointData *)jitTransferData,(uint)sharedPropertyGuard_2,
                      (PropertyGuard **)&j);
      if ((bool)cache_1._7_1_) {
        local_571 = PropertyGuard::IsValid(_j);
      }
      else {
        local_571 = false;
      }
      cache_1._6_1_ = local_571;
      if ((cache_1._7_1_ & 1) != 0) {
        for (cache_1._0_4_ = 0;
            (uint)cache_1 < _propertyId_2[sharedPropertyGuard_2._4_4_]->cacheCount;
            cache_1._0_4_ = (uint)cache_1 + 1) {
          threadContext_2 =
               *(ThreadContext **)
                (_propertyId_2[sharedPropertyGuard_2._4_4_] + (ulong)(uint)cache_1 + 1);
          if ((cache_1._6_1_ & 1) == 0) {
            ConstructorCache::InvalidateAsGuard((ConstructorCache *)threadContext_2);
          }
          else {
            ThreadContext::RegisterConstructorCache
                      ((ThreadContext *)entries,(uint)sharedPropertyGuard_2,
                       (ConstructorCache *)threadContext_2);
          }
        }
      }
    }
  }
  if (_propertyId->ctorCacheGuardsByPropertyId != (Type)0x0) {
    entry_1 = (CtorCacheGuardTransferEntry *)
              ScriptContext::GetThreadContext((ScriptContext *)nativeEntryPointData);
    for (pCStack_508 = _propertyId->ctorCacheGuardsByPropertyId; pCStack_508->propertyId != -1;
        pCStack_508 = pCStack_508 + (long)((int)cache_2 + 1) + 1) {
      sharedPropertyGuard_3._4_4_ = pCStack_508->propertyId;
      _entryCacheIndex = (PropertyGuard *)0x0;
      bVar2 = NativeEntryPointData::TryGetSharedPropertyGuard
                        ((NativeEntryPointData *)jitTransferData,sharedPropertyGuard_3._4_4_,
                         (PropertyGuard **)&entryCacheIndex);
      if (bVar2) {
        local_572 = PropertyGuard::IsValid(_entryCacheIndex);
      }
      else {
        local_572 = false;
      }
      cache_2._0_4_ = 0;
      while (pCStack_508[(long)(int)cache_2 + 1] != (CtorCacheGuardTransferEntry)0x0) {
        if (bVar2) {
          if (local_572 == false) {
            ConstructorCache::InvalidateAsGuard
                      ((ConstructorCache *)pCStack_508[(long)(int)cache_2 + 1]);
          }
          else {
            ThreadContext::RegisterConstructorCache
                      ((ThreadContext *)entry_1,sharedPropertyGuard_3._4_4_,
                       (ConstructorCache *)pCStack_508[(long)(int)cache_2 + 1]);
          }
        }
        cache_2._0_4_ = (int)cache_2 + 1;
      }
    }
  }
  iVar4 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])();
  uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)CONCAT44(extraout_var_03,iVar4));
  iVar4 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])();
  LVar6 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)CONCAT44(extraout_var_04,iVar4));
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01eb5b30,FailNativeCodeInstallPhase,uVar5,LVar6);
  if (!bVar2) {
    return;
  }
  Throw::OutOfMemory();
}

Assistant:

void EntryPointInfo::InstallGuards(ScriptContext* scriptContext)
    {
        NativeEntryPointData * nativeEntryPointData = this->GetNativeEntryPointData();
        JitTransferData * jitTransferData = this->GetNativeEntryPointData()->GetJitTransferData();
        Assert(jitTransferData != nullptr && jitTransferData->GetIsReady());

        for (int i = 0; i < jitTransferData->lazyBailoutPropertyCount; i++)
        {
            Assert(jitTransferData->lazyBailoutProperties != nullptr);

            Js::PropertyId propertyId = jitTransferData->lazyBailoutProperties[i];
            Js::PropertyGuard* sharedPropertyGuard = nullptr;
            bool hasSharedPropertyGuard = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
            Assert(hasSharedPropertyGuard);
            bool isValid = hasSharedPropertyGuard && sharedPropertyGuard->IsValid();
            if (isValid)
            {
                scriptContext->GetThreadContext()->RegisterLazyBailout(propertyId, this);
            }
            else
            {
                OUTPUT_TRACE2(Js::LazyBailoutPhase, this->GetFunctionBody(), _u("Lazy bailout - Invalidation due to property: %s \n"), scriptContext->GetPropertyName(propertyId)->GetBuffer());
                this->Invalidate(true);
                return;
            }
        }


        // in-proc JIT
        if (jitTransferData->equivalentTypeGuardCount > 0)
        {
            Assert(jitTransferData->equivalentTypeGuardOffsets == nullptr);
            Assert(jitTransferData->equivalentTypeGuards != nullptr);

            int guardCount = jitTransferData->equivalentTypeGuardCount;
            JitEquivalentTypeGuard** guards = jitTransferData->equivalentTypeGuards;

            EquivalentTypeCache * cache = nativeEntryPointData->EnsureEquivalentTypeCache(guardCount, scriptContext, this);

            for (JitEquivalentTypeGuard** guard = guards; guard < guards + guardCount; guard++)
            {
                EquivalentTypeCache* oldCache = (*guard)->GetCache();
                // Copy the contents of the heap-allocated cache to the recycler-allocated version to make sure the types are
                // kept alive. Allow the properties pointer to refer to the heap-allocated arrays. It will stay alive as long
                // as the entry point is alive, and property entries contain no pointers to other recycler allocated objects.
                (*cache) = (*oldCache);
                // Set the recycler-allocated cache on the (heap-allocated) guard.
                (*guard)->SetCache(cache);

                for (uint i = 0; i < EQUIVALENT_TYPE_CACHE_SIZE; i++)
                {
                    if((*cache).types[i] != nullptr)
                    {
                        (*cache).types[i]->SetHasBeenCached();
                    }
                    else
                    {
#ifdef DEBUG
                        for (uint __i = i; __i < EQUIVALENT_TYPE_CACHE_SIZE; __i++)
                        { Assert((*cache).types[__i] == nullptr); }
#endif
                        break; // type array must be shrinked.
                    }
                }
                cache++;
            }
        }

#if ENABLE_OOP_NATIVE_CODEGEN
        if (jitTransferData->equivalentTypeGuardOffsets)
        {
            // InstallGuards
            int guardCount = jitTransferData->equivalentTypeGuardOffsets->count;
            EquivalentTypeCache* cache = this->nativeEntryPointData->EnsureEquivalentTypeCache(guardCount, scriptContext, this);
            char * nativeDataBuffer = this->GetOOPNativeEntryPointData()->GetNativeDataBuffer();
            for (int i = 0; i < guardCount; i++)
            {
                auto& cacheIDL = jitTransferData->equivalentTypeGuardOffsets->guards[i].cache;
                auto guardOffset = jitTransferData->equivalentTypeGuardOffsets->guards[i].offset;
                JitEquivalentTypeGuard* guard = (JitEquivalentTypeGuard*)(nativeDataBuffer + guardOffset);
                cache[i].guard = guard;
                cache[i].hasFixedValue = cacheIDL.hasFixedValue != 0;
                cache[i].isLoadedFromProto = cacheIDL.isLoadedFromProto != 0;
                cache[i].nextEvictionVictim = cacheIDL.nextEvictionVictim;
                cache[i].record.propertyCount = cacheIDL.record.propertyCount;
                cache[i].record.properties = (EquivalentPropertyEntry*)(nativeDataBuffer + cacheIDL.record.propertyOffset);
                for (int j = 0; j < EQUIVALENT_TYPE_CACHE_SIZE; j++)
                {
                    cache[i].types[j] = (Js::Type*)cacheIDL.types[j];
                }
                guard->SetCache(&cache[i]);
            }
        }

        // OOP JIT
        if (jitTransferData->typeGuardTransferData.entries != nullptr)
        {
            int propertyGuardCount = jitTransferData->typeGuardTransferData.propertyGuardCount;
            Field(FakePropertyGuardWeakReference*) * propertyGuardWeakRefs = this->nativeEntryPointData->EnsurePropertyGuardWeakRefs(propertyGuardCount, scriptContext->GetRecycler());
            ThreadContext* threadContext = scriptContext->GetThreadContext();
            auto next = &jitTransferData->typeGuardTransferData.entries;
            while (*next)
            {
                Js::PropertyId propertyId = (*next)->propId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;
                if (isNeeded)
                {
                    char * nativeDataBuffer = this->GetOOPNativeEntryPointData()->GetNativeDataBuffer();
                    for (unsigned int i = 0; i < (*next)->guardsCount; i++)
                    {
                        Js::JitIndexedPropertyGuard* guard = (Js::JitIndexedPropertyGuard*)(nativeDataBuffer + (*next)->guardOffsets[i]);
                        int guardIndex = guard->GetIndex();
                        Assert(guardIndex >= 0 && guardIndex < propertyGuardCount);
                        // We use the shared guard here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the guard here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            auto propertyGuardWeakRef = propertyGuardWeakRefs[guardIndex];
                            if (propertyGuardWeakRef == nullptr)
                            {
                                propertyGuardWeakRef = Js::FakePropertyGuardWeakReference::New(scriptContext->GetRecycler(), guard);
                                propertyGuardWeakRefs[guardIndex] = propertyGuardWeakRef;
                            }
                            Assert(propertyGuardWeakRef->Get() == guard);
                            threadContext->RegisterUniquePropertyGuard(propertyId, propertyGuardWeakRef);
                        }
                        else
                        {
                            guard->Invalidate();
                        }
                    }
                }
                *next = (*next)->next;
            }
        }
#endif

        // in-proc JIT
        // The propertyGuardsByPropertyId structure is temporary and serves only to register the type guards for the correct
        // properties.  If we've done code gen for this EntryPointInfo, typePropertyGuardsByPropertyId will have been used and nulled out.
        if (jitTransferData->propertyGuardsByPropertyId != nullptr)
        {
            int propertyGuardCount = jitTransferData->propertyGuardCount;
            Field(FakePropertyGuardWeakReference*) * propertyGuardWeakRefs = nativeEntryPointData->EnsurePropertyGuardWeakRefs(propertyGuardCount, scriptContext->GetRecycler());

            ThreadContext* threadContext = scriptContext->GetThreadContext();

            Js::TypeGuardTransferEntry* entry = jitTransferData->propertyGuardsByPropertyId;
            while (entry->propertyId != Js::Constants::NoProperty)
            {
                Js::PropertyId propertyId = entry->propertyId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;
                int entryGuardIndex = 0;
                while (entry->guards[entryGuardIndex] != nullptr)
                {
                    if (isNeeded)
                    {
                        Js::JitIndexedPropertyGuard* guard = entry->guards[entryGuardIndex];
                        int guardIndex = guard->GetIndex();
                        Assert(guardIndex >= 0 && guardIndex < propertyGuardCount);
                        // We use the shared guard here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the guard here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            auto propertyGuardWeakRef = propertyGuardWeakRefs[guardIndex];
                            if (propertyGuardWeakRef == nullptr)
                            {
                                propertyGuardWeakRef = Js::FakePropertyGuardWeakReference::New(scriptContext->GetRecycler(), guard);
                                propertyGuardWeakRefs[guardIndex] = propertyGuardWeakRef;
                            }
                            Assert(propertyGuardWeakRef->Get() == guard);
                            threadContext->RegisterUniquePropertyGuard(propertyId, propertyGuardWeakRef);
                        }
                        else
                        {
                            guard->Invalidate();
                        }
                    }
                    entryGuardIndex++;
                }
                entry = reinterpret_cast<Js::TypeGuardTransferEntry*>(&entry->guards[++entryGuardIndex]);
            }
        }


        // The ctorCacheGuardsByPropertyId structure is temporary and serves only to register the constructor cache guards for the correct
        // properties.  If we've done code gen for this EntryPointInfo, ctorCacheGuardsByPropertyId will have been used and nulled out.
        // Unlike type property guards, constructor cache guards use the live constructor caches associated with function objects. These are
        // recycler allocated and are kept alive by the constructorCaches field, where they were inserted during work item creation.

        // OOP JIT
        if (jitTransferData->ctorCacheTransferData.entries != nullptr)
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();

            CtorCacheTransferEntryIDL ** entries = jitTransferData->ctorCacheTransferData.entries;
            for (uint i = 0; i < jitTransferData->ctorCacheTransferData.ctorCachesCount; ++i)
            {
                Js::PropertyId propertyId = entries[i]->propId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;

                if (isNeeded)
                {
                    for (uint j = 0; j < entries[i]->cacheCount; ++j)
                    {
                        Js::ConstructorCache* cache = (Js::ConstructorCache*)(entries[i]->caches[j]);
                        // We use the shared cache here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the cache here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            threadContext->RegisterConstructorCache(propertyId, cache);
                        }
                        else
                        {
                            cache->InvalidateAsGuard();
                        }
                    }
                }
            }
        }

        if (jitTransferData->ctorCacheGuardsByPropertyId != nullptr)
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();

            Js::CtorCacheGuardTransferEntry* entry = jitTransferData->ctorCacheGuardsByPropertyId;
            while (entry->propertyId != Js::Constants::NoProperty)
            {
                Js::PropertyId propertyId = entry->propertyId;
                Js::PropertyGuard* sharedPropertyGuard = nullptr;

                // We use the shared guard created during work item creation to ensure that the condition we assumed didn't change while
                // we were JIT-ing. If we don't have a shared property guard for this property then we must not need to protect it,
                // because it exists on the instance.  Unfortunately, this means that if we have a bug and fail to create a shared
                // guard for some property during work item creation, we won't find out about it here.
                bool isNeeded = nativeEntryPointData->TryGetSharedPropertyGuard(propertyId, sharedPropertyGuard);
                bool isValid = isNeeded ? sharedPropertyGuard->IsValid() : false;
                int entryCacheIndex = 0;
                while (entry->caches[entryCacheIndex] != 0)
                {
                    if (isNeeded)
                    {
                        Js::ConstructorCache* cache = (Js::ConstructorCache*)(entry->caches[entryCacheIndex]);
                        // We use the shared cache here to make sure the conditions we assumed didn't change while we were JIT-ing.
                        // If they did, we proactively invalidate the cache here, so that we bail out if we try to call this code.
                        if (isValid)
                        {
                            threadContext->RegisterConstructorCache(propertyId, cache);
                        }
                        else
                        {
                            cache->InvalidateAsGuard();
                        }
                    }
                    entryCacheIndex++;
                }
                entry = reinterpret_cast<Js::CtorCacheGuardTransferEntry*>(&entry->caches[++entryCacheIndex]);
            }
        }

        if (PHASE_ON(Js::FailNativeCodeInstallPhase, this->GetFunctionBody()))
        {
            Js::Throw::OutOfMemory();
        }
    }